

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3PoslistMerge(char **pp,char **pp1,char **pp2)

{
  char *pcVar1;
  sqlite3_int64 sVar2;
  sqlite3_int64 sVar3;
  char *pcVar4;
  int iVar5;
  sqlite3_int64 iVal;
  sqlite3_int64 *pi;
  char **ppcVar6;
  int iCol2;
  int iCol1;
  char *p1;
  sqlite3_int64 i2;
  sqlite3_int64 i1;
  char *p2;
  char *p;
  sqlite3_int64 iPrev;
  int local_80;
  int local_7c;
  char *local_78;
  sqlite3_int64 local_70;
  sqlite3_int64 local_68;
  char *local_60;
  char *local_58;
  sqlite3_int64 local_50;
  char **local_48;
  char **local_40;
  char **local_38;
  
  local_58 = *pp;
  local_78 = *pp1;
  local_60 = *pp2;
  local_48 = pp;
  local_40 = pp1;
  local_38 = pp2;
  do {
    while( true ) {
      pcVar1 = local_78;
      if (*local_78 == '\0') {
        if (*local_60 == '\0') {
          *local_58 = '\0';
          *local_48 = local_58 + 1;
          *local_40 = local_78 + 1;
          *local_38 = local_60 + 1;
          return;
        }
        local_7c = 0x7fffffff;
        iVar5 = local_7c;
      }
      else if (*local_78 == '\x01') {
        iVar5 = (int)local_78[1];
        if (local_78[1] < '\0') {
          sqlite3Fts3GetVarint32(local_78 + 1,&local_7c);
          iVar5 = local_7c;
        }
      }
      else {
        local_7c = 0;
        iVar5 = local_7c;
      }
      local_7c = iVar5;
      pcVar4 = local_60;
      if (*local_60 == '\0') {
        local_80 = 0x7fffffff;
        iVar5 = local_80;
      }
      else if (*local_60 == '\x01') {
        iVar5 = (int)local_60[1];
        if (local_60[1] < '\0') {
          sqlite3Fts3GetVarint32(local_60 + 1,&local_80);
          iVar5 = local_80;
        }
      }
      else {
        local_80 = 0;
        iVar5 = local_80;
      }
      local_80 = iVar5;
      if (local_7c == local_80) break;
      if (local_7c < local_80) {
        iVar5 = fts3PutColNumber(&local_58,local_7c);
        local_78 = pcVar1 + iVar5;
        ppcVar6 = &local_78;
      }
      else {
        iVar5 = fts3PutColNumber(&local_58,local_80);
        local_60 = pcVar4 + iVar5;
        ppcVar6 = &local_60;
      }
      fts3ColumnlistCopy(&local_58,ppcVar6);
    }
    local_68 = 0;
    local_70 = 0;
    local_50 = 0;
    iVar5 = fts3PutColNumber(&local_58,local_80);
    local_78 = pcVar1 + iVar5;
    local_60 = pcVar4 + iVar5;
    fts3GetDeltaVarint(&local_78,&local_68);
    fts3GetDeltaVarint(&local_60,&local_70);
    do {
      sVar3 = local_68;
      sVar2 = local_70;
      iVal = local_70;
      if (local_68 < local_70) {
        iVal = local_68;
      }
      fts3PutDeltaVarint(&local_58,&local_50,iVal);
      local_50 = local_50 + -2;
      if (sVar3 == sVar2) {
        fts3ReadNextPos(&local_78,&local_68);
LAB_0016f278:
        pi = &local_70;
        ppcVar6 = &local_60;
      }
      else {
        if (sVar2 <= sVar3) goto LAB_0016f278;
        ppcVar6 = &local_78;
        pi = &local_68;
      }
      fts3ReadNextPos(ppcVar6,pi);
    } while (local_70 != 0x7fffffff || local_68 != 0x7fffffff);
  } while( true );
}

Assistant:

static void fts3PoslistMerge(
  char **pp,                      /* Output buffer */
  char **pp1,                     /* Left input list */
  char **pp2                      /* Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;

  while( *p1 || *p2 ){
    int iCol1;         /* The current column index in pp1 */
    int iCol2;         /* The current column index in pp2 */

    if( *p1==POS_COLUMN ) fts3GetVarint32(&p1[1], &iCol1);
    else if( *p1==POS_END ) iCol1 = POSITION_LIST_END;
    else iCol1 = 0;

    if( *p2==POS_COLUMN ) fts3GetVarint32(&p2[1], &iCol2);
    else if( *p2==POS_END ) iCol2 = POSITION_LIST_END;
    else iCol2 = 0;

    if( iCol1==iCol2 ){
      sqlite3_int64 i1 = 0;       /* Last position from pp1 */
      sqlite3_int64 i2 = 0;       /* Last position from pp2 */
      sqlite3_int64 iPrev = 0;
      int n = fts3PutColNumber(&p, iCol1);
      p1 += n;
      p2 += n;

      /* At this point, both p1 and p2 point to the start of column-lists
      ** for the same column (the column with index iCol1 and iCol2).
      ** A column-list is a list of non-negative delta-encoded varints, each 
      ** incremented by 2 before being stored. Each list is terminated by a
      ** POS_END (0) or POS_COLUMN (1). The following block merges the two lists
      ** and writes the results to buffer p. p is left pointing to the byte
      ** after the list written. No terminator (POS_END or POS_COLUMN) is
      ** written to the output.
      */
      fts3GetDeltaVarint(&p1, &i1);
      fts3GetDeltaVarint(&p2, &i2);
      do {
        fts3PutDeltaVarint(&p, &iPrev, (i1<i2) ? i1 : i2); 
        iPrev -= 2;
        if( i1==i2 ){
          fts3ReadNextPos(&p1, &i1);
          fts3ReadNextPos(&p2, &i2);
        }else if( i1<i2 ){
          fts3ReadNextPos(&p1, &i1);
        }else{
          fts3ReadNextPos(&p2, &i2);
        }
      }while( i1!=POSITION_LIST_END || i2!=POSITION_LIST_END );
    }else if( iCol1<iCol2 ){
      p1 += fts3PutColNumber(&p, iCol1);
      fts3ColumnlistCopy(&p, &p1);
    }else{
      p2 += fts3PutColNumber(&p, iCol2);
      fts3ColumnlistCopy(&p, &p2);
    }
  }

  *p++ = POS_END;
  *pp = p;
  *pp1 = p1 + 1;
  *pp2 = p2 + 1;
}